

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMatrixX.h
# Opt level: O1

btMatrixX<float> * __thiscall
btMatrixX<float>::operator*
          (btMatrixX<float> *__return_storage_ptr__,btMatrixX<float> *this,btMatrixX<float> *other)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  float *pfVar5;
  float *pfVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  float *pfVar12;
  float *pfVar13;
  ulong uVar14;
  uint uVar15;
  float fVar16;
  
  btMatrixX(__return_storage_ptr__,this->m_rows,other->m_cols);
  setZero(__return_storage_ptr__);
  lVar7 = (long)__return_storage_ptr__->m_cols;
  if (0 < lVar7) {
    uVar1 = __return_storage_ptr__->m_rows;
    iVar8 = __return_storage_ptr__->m_setElemOperations;
    uVar2 = this->m_rows;
    lVar10 = 0;
    lVar11 = 0;
    do {
      if (0 < (int)uVar1) {
        iVar3 = this->m_cols;
        pfVar12 = (this->m_storage).m_data;
        iVar4 = other->m_cols;
        pfVar5 = (__return_storage_ptr__->m_storage).m_data;
        pfVar6 = (other->m_storage).m_data;
        uVar9 = 0;
        do {
          if ((int)uVar2 < 1) {
            fVar16 = 0.0;
          }
          else {
            fVar16 = 0.0;
            uVar14 = 0;
            pfVar13 = (float *)((long)pfVar6 + lVar10);
            do {
              uVar15 = -(uint)(*pfVar13 != 0.0);
              fVar16 = (float)(~uVar15 & (uint)fVar16 |
                              (uint)(pfVar12[uVar14] * *pfVar13 + fVar16) & uVar15);
              uVar14 = uVar14 + 1;
              pfVar13 = pfVar13 + iVar4;
            } while (uVar2 != uVar14);
          }
          if ((fVar16 != 0.0) || (NAN(fVar16))) {
            iVar8 = iVar8 + 1;
            __return_storage_ptr__->m_setElemOperations = iVar8;
            pfVar5[lVar11 + uVar9 * lVar7] = fVar16;
          }
          uVar9 = uVar9 + 1;
          pfVar12 = pfVar12 + iVar3;
        } while (uVar9 != uVar1);
      }
      lVar11 = lVar11 + 1;
      lVar10 = lVar10 + 4;
    } while (lVar11 != lVar7);
  }
  return __return_storage_ptr__;
}

Assistant:

btMatrixX operator*(const btMatrixX& other)
	{
		//btMatrixX*btMatrixX implementation, brute force
		btAssert(cols() == other.rows());

		btMatrixX res(rows(),other.cols());
		res.setZero();
//		BT_PROFILE("btMatrixX mul");
		for (int j=0; j < res.cols(); ++j)
		{
			{
				for (int i=0; i < res.rows(); ++i)
				{
					T dotProd=0;
//					T dotProd2=0;
					//int waste=0,waste2=0;

					{
//						bool useOtherCol = true;
						{
							for (int v=0;v<rows();v++)
							{
								T w = (*this)(i,v);
								if (other(v,j)!=0.f)
								{
									dotProd+=w*other(v,j);	
								}
						
							}
						}
					}
					if (dotProd)
						res.setElem(i,j,dotProd);
				}
			}
		}
		return res;
	}